

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collation.cpp
# Opt level: O0

uint32_t icu_63::Collation::incTwoBytePrimaryByOffset
                   (uint32_t basePrimary,UBool isCompressible,int32_t offset)

{
  int iVar1;
  undefined4 local_18;
  undefined4 local_14;
  uint32_t primary;
  int32_t offset_local;
  UBool isCompressible_local;
  uint32_t basePrimary_local;
  
  if (isCompressible == '\0') {
    local_14 = ((basePrimary >> 0x10 & 0xff) - 2) + offset;
    iVar1 = local_14 % 0xfe + 2;
    local_14 = local_14 / 0xfe;
  }
  else {
    local_14 = ((basePrimary >> 0x10 & 0xff) - 4) + offset;
    iVar1 = local_14 % 0xfb + 4;
    local_14 = local_14 / 0xfb;
  }
  local_18 = iVar1 * 0x10000;
  return local_18 | (basePrimary & 0xff000000) + local_14 * 0x1000000;
}

Assistant:

uint32_t
Collation::incTwoBytePrimaryByOffset(uint32_t basePrimary, UBool isCompressible, int32_t offset) {
    // Extract the second byte, minus the minimum byte value,
    // plus the offset, modulo the number of usable byte values, plus the minimum.
    // Reserve the PRIMARY_COMPRESSION_LOW_BYTE and high byte if necessary.
    uint32_t primary;
    if(isCompressible) {
        offset += ((int32_t)(basePrimary >> 16) & 0xff) - 4;
        primary = (uint32_t)((offset % 251) + 4) << 16;
        offset /= 251;
    } else {
        offset += ((int32_t)(basePrimary >> 16) & 0xff) - 2;
        primary = (uint32_t)((offset % 254) + 2) << 16;
        offset /= 254;
    }
    // First byte, assume no further overflow.
    return primary | ((basePrimary & 0xff000000) + (uint32_t)(offset << 24));
}